

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O0

void process_player(void)

{
  _Bool _Var1;
  wchar_t wVar2;
  source origin;
  source sVar3;
  byte local_19;
  
  player_resting_complete_special(player);
  event_signal(EVENT_CHECK_INTERRUPT);
  do {
    notice_stuff(player);
    handle_stuff(player);
    event_signal(EVENT_REFRESH);
    pack_overflow((object *)0x0);
    player->upkeep->energy_use = L'\0';
    _Var1 = flag_has_dbg((player->state).pflags,3,9,"player->state.pflags","(PF_SEE_ORE)");
    if (((((_Var1) && (player->timed[6] == 0)) && (player->timed[4] == 0)) &&
        ((player->timed[0x19] == 0 && (player->timed[9] == 0)))) &&
       ((player->timed[3] == 0 && ((player->timed[0x1c] == 0 && (player->timed[5] == 0)))))) {
      sVar3 = source_none();
      origin.which = sVar3.which;
      origin._4_4_ = 0;
      origin.what = sVar3.what;
      effect_simple(L'\"',origin,"0",L'\0',L'\0',L'\0',L'\x03',L'\x03',(_Bool *)0x0);
    }
    if ((player->timed[3] != 0) ||
       (_Var1 = player_timed_grade_eq(player,L'\t',"Knocked Out"), _Var1)) {
      cmdq_push(CMD_SLEEP);
    }
    wVar2 = cmd_get_nrepeats();
    if (wVar2 < L'\x01') {
      if (player->upkeep->monster_race != (monster_race *)0x0) {
        player->upkeep->redraw = player->upkeep->redraw | 0x100000;
      }
      event_signal(EVENT_REFRESH);
    }
    else {
      event_signal(EVENT_COMMAND_REPEAT);
    }
    _Var1 = cmdq_pop(CTX_GAME);
    if ((!_Var1) || ((player->upkeep->playing & 1U) == 0)) break;
    process_player_cleanup();
    local_19 = 0;
    if ((player->upkeep->energy_use == L'\0') && (local_19 = 0, (player->is_dead & 1U) == 0)) {
      local_19 = player->upkeep->generate_level ^ 0xff;
    }
  } while ((local_19 & 1) != 0);
  notice_stuff(player);
  return;
}

Assistant:

void process_player(void)
{
	/* Check for interrupts */
	player_resting_complete_special(player);
	event_signal(EVENT_CHECK_INTERRUPT);

	/* Repeat until energy is reduced */
	do {
		/* Refresh */
		notice_stuff(player);
		handle_stuff(player);
		event_signal(EVENT_REFRESH);

		/* Hack -- Pack Overflow */
		pack_overflow(NULL);

		/* Assume free turn */
		player->upkeep->energy_use = 0;

		/* Dwarves detect treasure */
		if (player_has(player, PF_SEE_ORE)) {
			/* Only if they are in good shape */
			if (!player->timed[TMD_IMAGE] &&
				!player->timed[TMD_CONFUSED] &&
				!player->timed[TMD_AMNESIA] &&
				!player->timed[TMD_STUN] &&
				!player->timed[TMD_PARALYZED] &&
				!player->timed[TMD_TERROR] &&
				!player->timed[TMD_AFRAID])
				effect_simple(EF_DETECT_ORE, source_none(), "0", 0, 0, 0, 3, 3, NULL);
		}

		/* Paralyzed or Knocked Out player gets no turn */
		if (player->timed[TMD_PARALYZED] ||
			player_timed_grade_eq(player, TMD_STUN, "Knocked Out")) {
			cmdq_push(CMD_SLEEP);
		}

		/* Prepare for the next command */
		if (cmd_get_nrepeats() > 0) {
			event_signal(EVENT_COMMAND_REPEAT);
		} else {
			/* Check monster recall */
			if (player->upkeep->monster_race)
				player->upkeep->redraw |= (PR_MONSTER);

			/* Place cursor on player/target */
			event_signal(EVENT_REFRESH);
		}

		/* Get a command from the queue if there is one */
		if (!cmdq_pop(CTX_GAME))
			break;

		if (!player->upkeep->playing)
			break;

		process_player_cleanup();
	} while (!player->upkeep->energy_use &&
			 !player->is_dead &&
			 !player->upkeep->generate_level);

	/* Notice stuff (if needed) */
	notice_stuff(player);
}